

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

CordBuffer __thiscall
absl::lts_20250127::Cord::GetAppendBufferSlowPath
          (Cord *this,size_t block_size,size_t capacity,size_t min_capacity)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  CordzInfo *in_RAX;
  CordzInfo *this_00;
  ulong uVar5;
  uint8_t *puVar6;
  CordRepFlat *pCVar7;
  char *pcVar8;
  CordzInfo *extraout_RAX;
  CordzInfo *extraout_RAX_00;
  sbyte sVar9;
  byte bVar10;
  byte bVar11;
  ulong uVar12;
  CordRep *pCVar13;
  int iVar14;
  uint8_t *puVar15;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar16;
  ulong extraout_RDX_01;
  CordRepBtree *pCVar17;
  int iVar18;
  uint8_t *puVar19;
  sbyte sVar20;
  CordRepBtree *in_R8;
  CordRep *pCVar21;
  ExtractResult EVar22;
  CordBuffer CVar23;
  CordzUpdateScope scope;
  CordzUpdateScope local_38;
  CordRepBtree *tree;
  
  bVar11 = *(byte *)block_size;
  pCVar17 = (CordRepBtree *)(long)(char)bVar11;
  tree = *(CordRepBtree **)(block_size + 8);
  if (tree == (CordRepBtree *)0x0 || ((ulong)pCVar17 & 1) == 0) {
    local_38.info_ = in_RAX;
    if ((bVar11 & 1) != 0) {
      GetAppendBufferSlowPath();
      this_00 = extraout_RAX;
      in_R8 = pCVar17;
LAB_0032ac76:
      cord_internal::CordzInfo::Lock(this_00,kGetAppendBuffer);
      this_00 = extraout_RAX_00;
      goto LAB_0032a90f;
    }
    pCVar21 = (CordRep *)((ulong)pCVar17 >> 1);
    puVar6 = (uint8_t *)0xffffffffffffffff;
    if (!CARRY8(min_capacity,(ulong)pCVar21)) {
      puVar6 = pCVar21->storage + (min_capacity - 0xd);
    }
    if (capacity == 0) {
      if ((uint8_t *)0xf < puVar6) {
        pCVar7 = cord_internal::CordRepFlat::NewImpl<4096ul>((size_t)puVar6);
        uVar5 = extraout_RDX;
        goto LAB_0032ab22;
      }
      (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
      (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
      (this->contents_).data_.rep_.field_0.data[0] = '\x01';
      *(undefined8 *)((long)&(this->contents_).data_.rep_.field_0.as_tree.cordz_info + 1) = 0;
      (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
      uVar5 = 0;
    }
    else {
      if ((capacity ^ capacity - 1) <= capacity - 1) goto LAB_0032acbe;
      puVar15 = (uint8_t *)0x10000;
      if (puVar6 < (uint8_t *)0x10000) {
        puVar15 = puVar6;
      }
      puVar19 = (uint8_t *)0x10000;
      if (capacity < 0x10000) {
        puVar19 = (uint8_t *)capacity;
      }
      if (((puVar15 + 0xd < puVar19) && (puVar19 = puVar15 + 0xd, (uint8_t *)0xff3 < puVar6)) &&
         (puVar19 = puVar15, ((ulong)puVar15 & (ulong)(puVar15 + -1)) != 0)) {
        puVar6 = puVar15 + -1;
        if (puVar6 == (uint8_t *)0x0) {
          bVar10 = 0;
        }
        else {
          lVar4 = 0x3f;
          if (puVar6 != (uint8_t *)0x0) {
            for (; (ulong)puVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          bVar10 = (byte)lVar4 ^ 0x3f;
        }
        puVar6 = (uint8_t *)(1L << (-bVar10 & 0x3f));
        lVar4 = 0x3f;
        if (puVar15 != (uint8_t *)0x0) {
          for (; (ulong)puVar15 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        puVar19 = (uint8_t *)(1L << ((byte)lVar4 & 0x3f));
        if (puVar6 + (-0xd - (long)puVar15) < (uint8_t *)0x81) {
          puVar19 = puVar6;
        }
      }
      pCVar7 = cord_internal::CordRepFlat::NewImpl<262144ul>((size_t)(puVar19 + -0xd));
      uVar5 = extraout_RDX_00;
LAB_0032ab22:
      (pCVar7->super_CordRep).length = 0;
      (this->contents_).data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)pCVar7;
    }
    pcVar8 = (char *)((this->contents_).data_.rep_.field_0.as_tree.cordz_info + 0xd);
    if (((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
      pcVar8 = (this->contents_).data_.rep_.field_0.data + 1;
    }
    if (bVar11 < 0xf) {
      if (bVar11 < 7) {
        if (bVar11 != 0) {
          *pcVar8 = *(char *)(block_size + 1);
          cVar1 = *(char *)(block_size + 1 + ((ulong)pCVar17 >> 2));
          uVar5 = CONCAT71((int7)(uVar5 >> 8),cVar1);
          pcVar8[(ulong)pCVar17 >> 2] = cVar1;
          (pcVar8 + -1)[(long)pCVar21] = pCVar21->storage[block_size - 0xd];
        }
      }
      else {
        uVar3 = *(uint *)(pCVar21->storage + (block_size - 0x10));
        uVar5 = (ulong)uVar3;
        *(undefined4 *)pcVar8 = *(undefined4 *)(block_size + 1);
        *(uint *)(pcVar8 + -4 + (long)pCVar21) = uVar3;
      }
    }
    else {
      if (0x1f < bVar11) {
        __assert_fail("n <= 15",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x62,
                      "void absl::cord_internal::SmallMemmove(char *, const char *, size_t) [nullify_tail = false]"
                     );
      }
      uVar5 = *(ulong *)(pCVar21->storage + (block_size - 0x14));
      *(undefined8 *)pcVar8 = *(undefined8 *)(block_size + 1);
      *(ulong *)(pcVar8 + -8 + (long)pCVar21) = uVar5;
    }
    bVar10 = (this->contents_).data_.rep_.field_0.data[0];
    pCVar13 = (CordRep *)0xf;
    if ((bVar10 & 1) == 0) {
      bVar2 = *(byte *)((this->contents_).data_.rep_.field_0.as_tree.cordz_info + 0xc);
      iVar14 = -0xb8000;
      if (bVar2 < 0xbb) {
        iVar14 = -0xe80;
      }
      sVar20 = 0xc;
      if (bVar2 < 0xbb) {
        sVar20 = 6;
      }
      iVar18 = -0x10;
      if (0x42 < bVar2) {
        iVar18 = iVar14;
      }
      sVar9 = 3;
      if (0x42 < bVar2) {
        sVar9 = sVar20;
      }
      uVar5 = (ulong)((uint)bVar2 << sVar9);
      pCVar13 = (CordRep *)(long)(int)(((uint)bVar2 << sVar9) + iVar18 + -0xd);
    }
    if (pCVar21 <= pCVar13) {
      if ((bVar10 & 1) == 0) {
        **(ulong **)&(this->contents_).data_.rep_.field_0 = (ulong)pCVar21;
      }
      else {
        (this->contents_).data_.rep_.field_0.data[0] = bVar11 | 1;
      }
      *(undefined8 *)block_size = 0;
      *(undefined8 *)(block_size + 8) = 0;
      goto LAB_0032ac5f;
    }
    GetAppendBufferSlowPath();
    tree = pCVar17;
LAB_0032ac8d:
    Mutex::AssertHeld(&((CordzInfo *)block_size)->mutex_);
    ((CordzInfo *)block_size)->rep_ = &tree->super_CordRep;
LAB_0032aa4f:
    if ((pCVar21->tag - 0xf9 < 7) || (pCVar21->tag < 6)) {
LAB_0032ac9f:
      __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                    ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
    }
    (this->contents_).data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)pCVar21;
  }
  else {
    this_00 = cord_internal::InlineData::cordz_info((InlineData *)block_size);
    local_38.info_ = this_00;
    if (this_00 != (CordzInfo *)0x0) goto LAB_0032ac76;
LAB_0032a90f:
    bVar11 = (tree->super_CordRep).tag;
    pCVar17 = (CordRepBtree *)CONCAT71((int7)((ulong)this_00 >> 8),bVar11);
    if (bVar11 == 3) {
      EVar22 = cord_internal::CordRepBtree::ExtractAppendBuffer(tree,(size_t)in_R8);
      tree = (CordRepBtree *)EVar22.tree;
    }
    else {
      if ((5 < bVar11) &&
         (pCVar17 = (CordRepBtree *)0x0,
         (tree->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2)) {
        bVar11 = (tree->super_CordRep).tag;
        if ((bVar11 - 0xf9 < 7) || (bVar11 < 6)) goto LAB_0032ac9f;
        iVar14 = -0xb8000;
        if (bVar11 < 0xbb) {
          iVar14 = -0xe80;
        }
        sVar20 = 0xc;
        if (bVar11 < 0xbb) {
          sVar20 = 6;
        }
        iVar18 = -0x10;
        if (0x42 < bVar11) {
          iVar18 = iVar14;
        }
        sVar9 = 3;
        if (0x42 < bVar11) {
          sVar9 = sVar20;
        }
        pCVar17 = (CordRepBtree *)
                  ((long)(int)(((uint)bVar11 << sVar9) + iVar18 + -0xd) -
                  (tree->super_CordRep).length);
        EVar22.extracted = &tree->super_CordRep;
        EVar22.tree = (CordRep *)pCVar17;
        if (in_R8 <= pCVar17) {
          tree = (CordRepBtree *)0x0;
          goto LAB_0032a9a1;
        }
      }
      EVar22.extracted = (CordRep *)0x0;
      EVar22.tree = &pCVar17->super_CordRep;
    }
LAB_0032a9a1:
    pCVar21 = EVar22.extracted;
    if (pCVar21 != (CordRep *)0x0) {
      if ((*(byte *)block_size & 1) == 0) {
        __assert_fail("data_.is_tree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                      ,0x4fe,
                      "void absl::Cord::InlineRep::SetTreeOrEmpty(absl::Nullable<CordRep *>, const CordzUpdateScope &)"
                     );
      }
      if (tree == (CordRepBtree *)0x0) {
        *(undefined8 *)block_size = 0;
        *(undefined8 *)(block_size + 8) = 0;
      }
      else {
        *(CordRepBtree **)(block_size + 8) = tree;
      }
      block_size = (size_t)local_38.info_;
      if (local_38.info_ != (CordzInfo *)0x0) goto LAB_0032ac8d;
      goto LAB_0032aa4f;
    }
    if (capacity == 0) {
      if (0xf < min_capacity) {
        pCVar7 = cord_internal::CordRepFlat::NewImpl<4096ul>(min_capacity);
        goto LAB_0032ac4d;
      }
      (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
      (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
      (this->contents_).data_.rep_.field_0.data[0] = '\x01';
      *(undefined8 *)((long)&(this->contents_).data_.rep_.field_0.as_tree.cordz_info + 1) = 0;
      (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
    }
    else {
      if ((capacity ^ capacity - 1) <= capacity - 1) {
LAB_0032acbe:
        __assert_fail("IsPow2(block_size)",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord_buffer.h"
                      ,0x1dd,
                      "static CordBuffer absl::CordBuffer::CreateWithCustomLimitImpl(size_t, size_t, AllocationHints...) [AllocationHints = <>]"
                     );
      }
      uVar5 = 0x10000;
      if (min_capacity < 0x10000) {
        uVar5 = min_capacity;
      }
      uVar12 = 0x10000;
      if (capacity < 0x10000) {
        uVar12 = capacity;
      }
      if (((uVar5 + 0xd < uVar12) && (uVar12 = uVar5 + 0xd, 0xff3 < min_capacity)) &&
         (uVar12 = uVar5, (uVar5 & uVar5 - 1) != 0)) {
        uVar12 = uVar5 - 1;
        if (uVar12 == 0) {
          bVar11 = 0;
        }
        else {
          lVar4 = 0x3f;
          if (uVar12 != 0) {
            for (; uVar12 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          bVar11 = (byte)lVar4 ^ 0x3f;
        }
        uVar16 = 1L << (-bVar11 & 0x3f);
        lVar4 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        uVar12 = 1L << ((byte)lVar4 & 0x3f);
        if ((uVar16 - uVar5) - 0xd < 0x81) {
          uVar12 = uVar16;
        }
      }
      pCVar7 = cord_internal::CordRepFlat::NewImpl<262144ul>(uVar12 - 0xd);
LAB_0032ac4d:
      (pCVar7->super_CordRep).length = 0;
      (this->contents_).data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)pCVar7;
    }
  }
  cord_internal::CordzUpdateScope::~CordzUpdateScope(&local_38);
  uVar5 = extraout_RDX_01;
LAB_0032ac5f:
  CVar23.rep_.field_0.long_rep.padding = (void *)uVar5;
  CVar23.rep_.field_0.long_rep.rep = (CordRepFlat *)this;
  return (CordBuffer)CVar23.rep_.field_0;
}

Assistant:

CordBuffer Cord::GetAppendBufferSlowPath(size_t block_size, size_t capacity,
                                         size_t min_capacity) {
  auto constexpr method = CordzUpdateTracker::kGetAppendBuffer;
  CordRep* tree = contents_.tree();
  if (tree != nullptr) {
    CordzUpdateScope scope(contents_.cordz_info(), method);
    CordRep::ExtractResult result = ExtractAppendBuffer(tree, min_capacity);
    if (result.extracted != nullptr) {
      contents_.SetTreeOrEmpty(result.tree, scope);
      return CordBuffer(result.extracted->flat());
    }
    return block_size ? CordBuffer::CreateWithCustomLimit(block_size, capacity)
                      : CordBuffer::CreateWithDefaultLimit(capacity);
  }
  return CreateAppendBuffer(contents_.data_, block_size, capacity);
}